

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Relations dg::vr::Relations::getAugmented(Relations rels)

{
  Type type;
  Type TVar1;
  bitset<12UL> bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  lVar7 = 0;
  do {
    type = *(Type *)((long)&all + lVar7);
    uVar6 = (ulong)type;
    if ((0x2a8UL >> (uVar6 & 0x3f) & 1) != 0) {
      TVar1 = getNonStrict(type);
      uVar3 = 1L << ((byte)TVar1 & 0x3f);
      if ((1L << ((byte)type & 0x3f) & (ulong)rels.bits.super__Base_bitset<1UL>._M_w) == 0) {
        if ((uVar3 & (ulong)rels.bits.super__Base_bitset<1UL>._M_w) != 0) {
          if (PF < type) {
            iVar4 = 0x102170;
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar6,0xc
                      );
            uVar5 = iVar4 - 3;
            if ((uVar5 < 7) && ((0x55U >> (uVar5 & 0x1f) & 1) != 0)) {
              bVar2.super__Base_bitset<1UL>._M_w._4_4_ = 0;
              bVar2.super__Base_bitset<1UL>._M_w._0_4_ = *(uint *)(&DAT_00102148 + (ulong)uVar5 * 4)
              ;
              return (Relations)bVar2.super__Base_bitset<1UL>._M_w;
            }
            abort();
          }
          rels.bits.super__Base_bitset<1UL>._M_w =
               (bitset<12UL>)
               ((ulong)rels.bits.super__Base_bitset<1UL>._M_w | 1L << (uVar6 & 0x3f) | 1);
        }
      }
      else {
        rels.bits.super__Base_bitset<1UL>._M_w =
             (bitset<12UL>)((ulong)rels.bits.super__Base_bitset<1UL>._M_w | uVar3);
      }
    }
    lVar7 = lVar7 + 4;
    if (lVar7 == 0x30) {
      return (Relations)(_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
    }
  } while( true );
}

Assistant:

Relations Relations::getAugmented(Relations rels) {
    Relations augmented = rels;
    for (Relations::Type type : Relations::all) {
        if (!strict.has(type))
            continue;

        if (augmented.has(type)) {
            augmented.set(Relations::getNonStrict(type));
        } else if (augmented.has(Relations::getNonStrict(type))) {
            augmented.set(type);
            augmented.eq();
        }
    }
    return augmented;
}